

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<double>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  double dVar3;
  
  pdVar1 = result->data;
  dVar3 = NumericStats::GetMin<double>(&(segment->stats).statistics);
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    *(double *)(pdVar1 + iVar2 * 8 + start_idx * 8) = dVar3;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}